

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

Status __thiscall HighsLpRelaxation::resolveLp(HighsLpRelaxation *this,HighsDomain *domain)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  CliqueVar CVar4;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var5;
  HighsMipSolver *pHVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pLVar9;
  pointer pdVar10;
  pointer ppVar11;
  pointer pSVar12;
  HighsLp *pHVar13;
  Status SVar14;
  HighsInt HVar15;
  ValueType *pVVar16;
  u64 uVar17;
  ulong uVar18;
  pointer pdVar19;
  pointer pdVar20;
  HighsHashTableEntry<int,_std::pair<double,_int>_> *pHVar21;
  uint uVar22;
  HighsHashTableEntry<int,_std::pair<double,_int>_> *__args;
  ulong uVar23;
  uchar *puVar24;
  long lVar25;
  uchar *puVar26;
  int iVar27;
  pair<int,_double> *fracint;
  long lVar28;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uVar29;
  uchar *puVar30;
  uchar *puVar31;
  uchar *puVar32;
  pointer ppVar33;
  bool bVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  double dVar40;
  HighsInt col;
  HighsHashTable<int,_std::pair<double,_int>_> fracints;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range4;
  double local_c0;
  vector<double,_std::allocator<double>_> local_b8;
  pointer local_98;
  double local_90;
  HighsMipSolver *local_88;
  vector<double,_std::allocator<double>_> *local_80;
  HighsHashTable<int,_std::pair<double,_int>_> local_78;
  pointer local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *local_38;
  
  ppVar33 = (this->fractionalints).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar33) {
    (this->fractionalints).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar33;
  }
  local_38 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
             &this->fractionalints;
  local_40 = &(this->lpsolver).model_.lp_.col_lower_;
  local_48 = &(this->lpsolver).model_.lp_.col_upper_;
  local_80 = &(this->lpsolver).solution_.col_value;
  do {
    if (domain != (HighsDomain *)0x0) {
      flushDomain(this,domain,false);
    }
    SVar14 = run(this,true);
    this->status = SVar14;
    if ((2 < SVar14 - kUnscaledDualFeasible) && (SVar14 != kOptimal)) {
      if (SVar14 == kInfeasible) {
        this->objective = INFINITY;
      }
      break;
    }
    HighsHashTable<int,_std::pair<double,_int>_>::HighsHashTable
              (&local_78,(long)this->maxNumFractional);
    _Var5._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    pdVar20 = *(pointer *)
               &((_Var5._M_head_impl)->integral_cols).super__Vector_base<int,_std::allocator<int>_>;
    local_98 = *(pointer *)((long)&(_Var5._M_head_impl)->integral_cols + 8);
    if (pdVar20 == local_98) {
      bVar34 = true;
    }
    else {
      bVar34 = true;
      do {
        iVar27 = *(int *)pdVar20;
        lVar25 = (long)iVar27;
        pHVar6 = this->mipsolver;
        dVar36 = (this->lpsolver).model_.lp_.col_upper_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar25];
        local_90 = (this->lpsolver).solution_.col_value.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar25];
        if (local_90 <= dVar36) {
          dVar36 = local_90;
        }
        local_c0 = (this->lpsolver).model_.lp_.col_lower_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar25];
        if (local_c0 <= dVar36) {
          local_c0 = dVar36;
        }
        dVar35 = round(local_c0);
        _Var5._M_head_impl =
             (pHVar6->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        dVar36 = (_Var5._M_head_impl)->feastol;
        if (ABS(local_c0 - dVar35) <= dVar36) {
          iVar27 = 6;
          if ((this->lpsolver).basis_.col_status.
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start[lVar25] != kBasic) {
            dVar35 = *(double *)
                      (*(long *)&((vector<double,_std::allocator<double>_> *)
                                 ((long)&(_Var5._M_head_impl)->domain + 800))->
                                 super__Vector_base<double,_std::allocator<double>_> + lVar25 * 8) -
                     local_90;
            dVar37 = local_90 -
                     *(double *)
                      (*(long *)&((vector<double,_std::allocator<double>_> *)
                                 ((long)&(_Var5._M_head_impl)->domain + 0x308))->
                                 super__Vector_base<double,_std::allocator<double>_> + lVar25 * 8);
            if (dVar35 <= dVar37) {
              dVar37 = dVar35;
            }
            if (dVar36 < dVar37) {
              piVar7 = (this->lpsolver).model_.lp_.a_matrix_.start_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              piVar8 = (pHVar6->model_->a_matrix_).start_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              lVar28 = ((long)piVar8[lVar25 + 1] - (long)piVar8[lVar25]) + (long)piVar7[lVar25];
              iVar2 = piVar7[lVar25 + 1];
              if (((int)lVar28 != iVar2) && (iVar27 = 0, (int)lVar28 < iVar2)) {
                piVar7 = (this->lpsolver).model_.lp_.a_matrix_.index_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pLVar9 = (this->lprows).
                         super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pdVar10 = (this->lpsolver).solution_.row_value.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar19 = (this->lpsolver).model_.lp_.row_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  iVar3 = piVar7[lVar28];
                  if ((pLVar9[iVar3].age != 0) &&
                     (dVar35 = pdVar19[iVar3] - dVar36, pdVar1 = pdVar10 + iVar3,
                     dVar35 < *pdVar1 || dVar35 == *pdVar1)) {
                    pLVar9[iVar3].age = 0;
                  }
                  lVar28 = lVar28 + 1;
                } while (lVar28 < iVar2);
              }
            }
          }
        }
        else {
          local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_b8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar27);
          if (bVar34) {
            if (*(int *)(*(long *)&((_Var5._M_head_impl)->uplocks).
                                   super__Vector_base<int,_std::allocator<int>_> + lVar25 * 4) == 0)
            {
              bVar34 = true;
            }
            else {
              bVar34 = *(int *)(*(long *)&((_Var5._M_head_impl)->downlocks).
                                          super__Vector_base<int,_std::allocator<int>_> + lVar25 * 4
                               ) == 0;
            }
          }
          else {
            bVar34 = false;
          }
          lVar28 = (long)*(int *)(*(long *)&((vector<int,_std::allocator<int>_> *)
                                            ((long)&(_Var5._M_head_impl)->cliquetable + 0x100))->
                                            super__Vector_base<int,_std::allocator<int>_> +
                                 lVar25 * 4);
          lVar25 = lVar28 * 8 +
                   *(long *)&((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                               *)((long)&(_Var5._M_head_impl)->cliquetable + 0x118))->
                             super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                   + -8;
          if (lVar25 != 0 && lVar28 != 0) {
            do {
              uVar22 = *(uint *)(lVar25 + 4);
              pdVar10 = (this->lpsolver).model_.lp_.col_lower_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              dVar36 = pdVar10[uVar22 & 0x7fffffff];
              pdVar1 = (this->lpsolver).model_.lp_.col_upper_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + (uVar22 & 0x7fffffff);
              if ((dVar36 == *pdVar1) && (!NAN(dVar36) && !NAN(*pdVar1))) {
                if (domain == (HighsDomain *)0x0) break;
                if (-1 < (int)uVar22) {
                  dVar36 = 1.0 - pdVar10[uVar22];
                }
                HighsDomain::fixCol(domain,(HighsInt)
                                           local_b8.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start,dVar36,
                                    (Reason)0xfffffffe);
                if (domain->infeasible_ == true) {
                  this->objective = INFINITY;
                  this->status = kInfeasible;
                  iVar27 = 1;
                  goto LAB_002b2d7e;
                }
              }
              uVar22 = *(uint *)(lVar25 + 4);
              local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)(CONCAT44(local_b8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,uVar22) &
                            0xffffffff7fffffff);
              if (-1 < (int)uVar22) {
                local_c0 = 1.0 - local_c0;
              }
              _Var5._M_head_impl =
                   (this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              lVar28 = (long)*(int *)(*(long *)&((vector<int,_std::allocator<int>_> *)
                                                ((long)&(_Var5._M_head_impl)->cliquetable + 0x100))
                                                ->super__Vector_base<int,_std::allocator<int>_> +
                                     (ulong)(uVar22 & 0x7fffffff) * 4);
              lVar25 = *(long *)&((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                                   *)((long)&(_Var5._M_head_impl)->cliquetable + 0x118))->
                                 super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                       + -8 + lVar28 * 8;
              if (lVar28 == 0) {
                lVar25 = 0;
              }
            } while (lVar25 != 0);
          }
          if (this->adjustSymBranchingCol == true) {
            HVar15 = HighsSymmetries::getBranchingColumn
                               (&((this->mipsolver->mipdata_)._M_t.
                                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)
                                 ->symmetries,local_40,local_48,
                                (HighsInt)
                                local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
            local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_b8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,HVar15);
          }
          pVVar16 = HighsHashTable<int,_std::pair<double,_int>_>::operator[]
                              (&local_78,(KeyType_conflict *)&local_b8);
          pVVar16->first = local_c0 + pVVar16->first;
          pVVar16->second = pVVar16->second + 1;
          iVar27 = 0;
        }
LAB_002b2d7e:
        if ((iVar27 != 6) && (iVar27 != 0)) goto LAB_002b2dc8;
        pdVar20 = (pointer)((long)pdVar20 + 4);
      } while (pdVar20 != local_98);
    }
    iVar27 = 5;
LAB_002b2dc8:
    if (iVar27 == 5) {
      iVar27 = this->maxNumFractional;
      if (this->maxNumFractional <= (int)local_78.numElements) {
        iVar27 = (int)local_78.numElements;
      }
      this->maxNumFractional = iVar27;
      if ((domain == (HighsDomain *)0x0) ||
         ((domain->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (domain->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        if (local_78.numElements == 0) {
          puVar24 = (uchar *)((long)local_78.metadata._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                             local_78.tableSizeMask + 1);
          pHVar21 = (HighsHashTableEntry<int,_std::pair<double,_int>_> *)
                    ((long)local_78.entries._M_t.
                           super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                           .
                           super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>
                           ._M_head_impl + (local_78.tableSizeMask + 1) * 0x18);
          puVar32 = puVar24;
        }
        else {
          puVar24 = (uchar *)((long)local_78.metadata._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                             local_78.tableSizeMask + 1);
          pHVar21 = (HighsHashTableEntry<int,_std::pair<double,_int>_> *)
                    ((long)local_78.entries._M_t.
                           super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                           .
                           super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>
                           ._M_head_impl + (local_78.tableSizeMask + 1) * 0x18);
          uVar29._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
          _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               local_78.metadata;
          for (uVar17 = local_78.tableSizeMask;
              (puVar32 = (uchar *)uVar29._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
              -1 < (char)*(uchar *)uVar29._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl &&
              (puVar32 = puVar24, uVar17 != 0)); uVar17 = uVar17 - 1) {
            uVar29._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                 (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
                 ((long)uVar29._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1);
          }
        }
        if (puVar32 !=
            (uchar *)((long)local_78.metadata._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                     local_78.tableSizeMask + 1)) {
          puVar26 = (uchar *)((long)local_78.metadata._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                             local_78.tableSizeMask);
          do {
            __args = pHVar21 + ((long)puVar32 - (long)puVar24);
            local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((__args->value_).first / (double)(__args->value_).second);
            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
            emplace_back<int_const&,double>(local_38,&__args->key_,(double *)&local_b8);
            do {
              puVar31 = puVar32;
              puVar30 = puVar31 + 1;
              puVar32 = puVar24;
              if (puVar30 == puVar24) break;
              puVar32 = puVar30;
            } while (-1 < (char)*puVar30);
          } while (puVar31 != puVar26);
        }
        if ((bVar34) &&
           ((this->fractionalints).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (this->fractionalints).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          std::vector<double,_std::allocator<double>_>::vector(&local_b8,local_80);
          pdVar20 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppVar33 = (this->fractionalints).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar11 = (this->fractionalints).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (ppVar33 != ppVar11) {
            local_88 = this->mipsolver;
            local_98 = (this->lpsolver).model_.lp_.col_lower_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            _Var5._M_head_impl =
                 (local_88->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            local_90 = *(double *)
                        &((_Var5._M_head_impl)->uplocks).
                         super__Vector_base<int,_std::allocator<int>_>;
            local_50 = (this->lpsolver).model_.lp_.col_upper_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            do {
              lVar25 = (long)ppVar33->first;
              if ((*(int *)((long)local_90 + lVar25 * 4) != 0) ||
                 ((pdVar1 = (local_88->model_->col_cost_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar25,
                  0.0 < *pdVar1 || *pdVar1 == 0.0 &&
                  (*(int *)(*(long *)&((_Var5._M_head_impl)->downlocks).
                                      super__Vector_base<int,_std::allocator<int>_> + lVar25 * 4) ==
                   0)))) {
                dVar36 = (_Var5._M_head_impl)->feastol;
                dVar37 = floor(ppVar33->second + dVar36);
                dVar35 = -INFINITY;
                if (-INFINITY < local_98[lVar25]) {
                  dVar35 = ceil(local_98[lVar25] - dVar36);
                }
                if (dVar35 <= dVar37) {
                  dVar35 = dVar37;
                }
              }
              else {
                dVar36 = (_Var5._M_head_impl)->feastol;
                dVar37 = ceil(ppVar33->second - dVar36);
                dVar35 = INFINITY;
                if (local_50[lVar25] < INFINITY) {
                  dVar35 = floor(dVar36 + local_50[lVar25]);
                }
                if (dVar37 <= dVar35) {
                  dVar35 = dVar37;
                }
              }
              pdVar20[lVar25] = dVar35;
              ppVar33 = ppVar33 + 1;
            } while (ppVar33 != ppVar11);
          }
          pHVar6 = this->mipsolver;
          _Var5._M_head_impl =
               (pHVar6->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          pSVar12 = (((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                       *)((long)&(_Var5._M_head_impl)->cliquetable + 0x118))->
                    super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar22 = (int)((ulong)((long)*(pointer *)
                                        ((long)&(_Var5._M_head_impl)->cliquetable + 0x120) -
                                (long)pSVar12) >> 3) - 1;
          if (-1 < (int)uVar22) {
            lVar25 = (ulong)uVar22 + 1;
            do {
              CVar4 = pSVar12[lVar25 + -1].replace;
              if ((long)(int)CVar4 < 0) {
                dVar36 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[(uint)CVar4 & 0x7fffffff];
              }
              else {
                dVar36 = 1.0 - local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[(int)CVar4];
              }
              local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[pSVar12[lVar25 + -1].substcol] = dVar36;
              lVar28 = lVar25 + -1;
              bVar34 = 0 < lVar25;
              lVar25 = lVar28;
            } while (lVar28 != 0 && bVar34);
          }
          pHVar13 = pHVar6->model_;
          uVar18 = (ulong)(uint)pHVar13->num_col_;
          if (uVar18 == 0) {
            dVar36 = 0.0;
          }
          else {
            dVar35 = 0.0;
            uVar23 = 0;
            dVar37 = 0.0;
            do {
              dVar40 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar23] *
                       (pHVar13->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar23];
              dVar36 = dVar37 + dVar40;
              dVar35 = dVar35 + (dVar37 - (dVar36 - dVar40)) +
                                (dVar40 - (dVar36 - (dVar36 - dVar40)));
              uVar23 = uVar23 + 1;
              dVar37 = dVar36;
            } while (uVar18 != uVar23);
            dVar36 = dVar36 + dVar35;
          }
          HighsMipSolverData::addIncumbent(_Var5._M_head_impl,&local_b8,dVar36,7,true,false);
          if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        pHVar13 = this->mipsolver->model_;
        uVar18 = (ulong)(uint)pHVar13->num_col_;
        if (uVar18 == 0) {
          local_90 = 0.0;
          dVar36 = 0.0;
        }
        else {
          dVar36 = 0.0;
          uVar23 = 0;
          dVar35 = 0.0;
          do {
            dVar37 = (this->lpsolver).solution_.col_value.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar23] *
                     (pHVar13->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar23];
            local_90 = dVar35 + dVar37;
            dVar36 = dVar36 + (dVar35 - (local_90 - dVar37)) +
                              (dVar37 - (local_90 - (local_90 - dVar37)));
            uVar23 = uVar23 + 1;
            dVar35 = local_90;
          } while (uVar18 != uVar23);
        }
        if ((((this->fractionalints).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              (this->fractionalints).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) && (this->status != kOptimal)) &&
           (this->status != kUnscaledPrimalFeasible)) {
          std::vector<double,_std::allocator<double>_>::vector(&local_b8,local_80);
          pdVar20 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_88 = this->mipsolver;
          pHVar13 = local_88->model_;
          lVar25 = (long)pHVar13->num_col_;
          if (0 < lVar25) {
            pdVar10 = (this->lpsolver).model_.lp_.col_lower_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar19 = (this->lpsolver).model_.lp_.col_upper_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar28 = 0;
            local_98 = pdVar19;
            do {
              dVar35 = pdVar20[lVar28];
              dVar37 = pdVar10[lVar28];
              uVar38 = SUB84(dVar37,0);
              uVar39 = (undefined4)((ulong)dVar37 >> 0x20);
              if (dVar35 < dVar37) {
LAB_002b328f:
                pdVar20[lVar28] = (double)CONCAT44(uVar39,uVar38);
              }
              else {
                dVar37 = pdVar19[lVar28];
                uVar38 = SUB84(dVar37,0);
                uVar39 = (undefined4)((ulong)dVar37 >> 0x20);
                if (dVar37 < dVar35) goto LAB_002b328f;
                if ((pHVar13->integrality_).
                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar28] != kContinuous) {
                  dVar35 = round(dVar35);
                  uVar38 = SUB84(dVar35,0);
                  uVar39 = (undefined4)((ulong)dVar35 >> 0x20);
                  pdVar19 = local_98;
                  goto LAB_002b328f;
                }
              }
              lVar28 = lVar28 + 1;
            } while (lVar25 != lVar28);
          }
          bVar34 = HighsMipSolverData::checkSolution
                             ((local_88->mipdata_)._M_t.
                              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
                              &local_b8);
          if (bVar34) {
            pdVar20 = (this->lpsolver).solution_.col_value.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            (this->lpsolver).solution_.col_value.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (this->lpsolver).solution_.col_value.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (this->lpsolver).solution_.col_value.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (pdVar20 != (pointer)0x0) {
              operator_delete(pdVar20);
            }
            this->status = (uint)((this->status - kOptimal & 0xfffffffd) != 0) * 3 + kOptimal;
          }
          if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        this->objective = local_90 + dVar36;
        iVar27 = 4;
        goto LAB_002b31d6;
      }
      bVar34 = true;
      iVar27 = 3;
    }
    else {
LAB_002b31d6:
      bVar34 = false;
    }
    HighsHashTable<int,_std::pair<double,_int>_>::~HighsHashTable(&local_78);
    if (1 < iVar27 - 3U) {
      return kInfeasible;
    }
  } while (bVar34);
  return this->status;
}

Assistant:

HighsLpRelaxation::Status HighsLpRelaxation::resolveLp(HighsDomain* domain) {
  fractionalints.clear();

  bool solveagain;
  do {
    solveagain = false;
    if (domain) flushDomain(*domain);
    status = run();

    switch (status) {
      case Status::kUnscaledInfeasible:
      case Status::kUnscaledDualFeasible:
      case Status::kUnscaledPrimalFeasible:
      case Status::kOptimal: {
        HighsHashTable<HighsInt, std::pair<double, int>> fracints(
            maxNumFractional);
        const HighsSolution& sol = lpsolver.getSolution();

        HighsCDouble objsum = 0;
        bool roundable = true;

        for (HighsInt i : mipsolver.mipdata_->integral_cols) {
          // for the fractionality we assume that LP bounds are not violated
          // bounds that are violated by the unscaled LP are indicated by the
          // return status already
          double val = std::max(
              std::min(sol.col_value[i], lpsolver.getLp().col_upper_[i]),
              lpsolver.getLp().col_lower_[i]);

          if (fractionality(val) > mipsolver.mipdata_->feastol) {
            HighsInt col = i;
            roundable = roundable && (mipsolver.mipdata_->uplocks[col] == 0 ||
                                      mipsolver.mipdata_->downlocks[col] == 0);

            const HighsCliqueTable::Substitution* subst =
                mipsolver.mipdata_->cliquetable.getSubstitution(col);
            while (subst != nullptr) {
              if (lpsolver.getLp().col_lower_[subst->replace.col] ==
                  lpsolver.getLp().col_upper_[subst->replace.col]) {
                if (domain) {
                  domain->fixCol(
                      col, subst->replace.weight(lpsolver.getLp().col_lower_));
                  if (domain->infeasible()) {
                    objective = kHighsInf;
                    status = Status::kInfeasible;
                    return status;
                  }
                } else
                  break;
              }

              col = subst->replace.col;
              if (subst->replace.val == 0) val = 1.0 - val;

              subst = mipsolver.mipdata_->cliquetable.getSubstitution(col);
            }

            if (adjustSymBranchingCol)
              col = mipsolver.mipdata_->symmetries.getBranchingColumn(
                  getLp().col_lower_, getLp().col_upper_, col);

            auto& pair = fracints[col];
            pair.first += val;
            pair.second += 1;
          } else {
            if (lpsolver.getBasis().col_status[i] == HighsBasisStatus::kBasic)
              continue;

            const double glb = mipsolver.mipdata_->domain.col_lower_[i];
            const double gub = mipsolver.mipdata_->domain.col_upper_[i];

            if (std::min(gub - sol.col_value[i], sol.col_value[i] - glb) <=
                mipsolver.mipdata_->feastol)
              continue;

            const auto& matrix = lpsolver.getLp().a_matrix_;
            const HighsInt colStart =
                matrix.start_[i] + (mipsolver.model_->a_matrix_.start_[i + 1] -
                                    mipsolver.model_->a_matrix_.start_[i]);
            const HighsInt colEnd = matrix.start_[i + 1];

            // skip further checks if the column has no entry in any cut
            if (colStart == colEnd) continue;

            for (HighsInt j = colStart; j < colEnd; ++j) {
              HighsInt row = matrix.index_[j];
              assert(row >= mipsolver.numRow());

              // age is already zero, so irrelevant whether we reset it
              if (lprows[row].age == 0) continue;

              // check that row has no slack in the current solution
              if (sol.row_value[row] <
                  getLp().row_upper_[row] - mipsolver.mipdata_->feastol)
                continue;

              lprows[row].age = 0;
            }
          }
        }

        maxNumFractional =
            std::max((HighsInt)fracints.size(), maxNumFractional);

        if (domain && !domain->getChangedCols().empty()) {
          // printf("resolving due to fixings of substituted columns\n");
          solveagain = true;
          continue;
        }

        for (const auto& it : fracints) {
          fractionalints.emplace_back(
              it.key(), it.value().first / (double)it.value().second);
        }

        if (roundable && !fractionalints.empty()) {
          std::vector<double> roundsol = sol.col_value;

          for (const std::pair<HighsInt, double>& fracint : fractionalints) {
            // get column index
            HighsInt col = fracint.first;
            // round based on locks and sign of objective coefficient
            if (mipsolver.mipdata_->uplocks[col] == 0 &&
                (mipsolver.colCost(col) < 0 ||
                 mipsolver.mipdata_->downlocks[col] != 0)) {
              // round up
              roundsol[col] = std::min(
                  std::ceil(fracint.second - mipsolver.mipdata_->feastol),
                  lpsolver.getLp().col_upper_[col] == kHighsInf
                      ? kHighsInf
                      : std::floor(lpsolver.getLp().col_upper_[col] +
                                   mipsolver.mipdata_->feastol));
            } else {
              // round down
              roundsol[col] = std::max(
                  std::floor(fracint.second + mipsolver.mipdata_->feastol),
                  lpsolver.getLp().col_lower_[col] == -kHighsInf
                      ? -kHighsInf
                      : std::ceil(lpsolver.getLp().col_lower_[col] -
                                  mipsolver.mipdata_->feastol));
            }
          }

          const auto& cliquesubst =
              mipsolver.mipdata_->cliquetable.getSubstitutions();
          for (HighsInt k = cliquesubst.size() - 1; k >= 0; --k) {
            if (cliquesubst[k].replace.val == 0)
              roundsol[cliquesubst[k].substcol] =
                  1 - roundsol[cliquesubst[k].replace.col];
            else
              roundsol[cliquesubst[k].substcol] =
                  roundsol[cliquesubst[k].replace.col];
          }

          for (HighsInt i = 0; i != mipsolver.numCol(); ++i)
            objsum += roundsol[i] * mipsolver.colCost(i);

          mipsolver.mipdata_->addIncumbent(roundsol, double(objsum),
                                           kSolutionSourceSolveLp);
          objsum = 0;
        }

        for (HighsInt i = 0; i != mipsolver.numCol(); ++i)
          objsum += sol.col_value[i] * mipsolver.colCost(i);

        if (fractionalints.empty() && !unscaledPrimalFeasible(status)) {
          std::vector<double> fixSol = sol.col_value;
          for (HighsInt i = 0; i < mipsolver.numCol(); ++i) {
            if (fixSol[i] < lpsolver.getLp().col_lower_[i])
              fixSol[i] = lpsolver.getLp().col_lower_[i];
            else if (fixSol[i] > lpsolver.getLp().col_upper_[i])
              fixSol[i] = lpsolver.getLp().col_upper_[i];
            else if (mipsolver.variableType(i) != HighsVarType::kContinuous)
              fixSol[i] = std::round(fixSol[i]);
          }

          if (mipsolver.mipdata_->checkSolution(fixSol)) {
            const_cast<std::vector<double>&>(sol.col_value) = std::move(fixSol);
            if (unscaledDualFeasible(status))
              status = Status::kOptimal;
            else
              status = Status::kUnscaledPrimalFeasible;
          }
        }

        objective = double(objsum);
        break;
      }
      case Status::kInfeasible:
        objective = kHighsInf;
        break;
      default:
        break;
    }
  } while (solveagain);

  return status;
}